

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# teglResizeTests.cpp
# Opt level: O2

void __thiscall deqp::egl::ResizeTest::resize(ResizeTest *this,IVec2 *size)

{
  ostringstream *this_00;
  NativeWindow *pNVar1;
  Vector<int,_2> VStack_1a8;
  undefined1 local_1a0 [384];
  
  pNVar1 = (this->m_nativeWindow).
           super_UniqueBase<eglu::NativeWindow,_de::DefaultDeleter<eglu::NativeWindow>_>.m_data.ptr;
  tcu::Vector<int,_2>::Vector(&VStack_1a8,size);
  (*pNVar1->_vptr_NativeWindow[6])(pNVar1,&VStack_1a8);
  (*((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_platform->_vptr_Platform[2])
            ();
  local_1a0._0_8_ = this->m_log;
  this_00 = (ostringstream *)(local_1a0 + 8);
  std::__cxx11::ostringstream::ostringstream(this_00);
  std::operator<<((ostream *)this_00,"Resized surface to size ");
  tcu::operator<<((ostream *)this_00,size);
  tcu::MessageBuilder::operator<<
            ((MessageBuilder *)local_1a0,(EndMessageToken *)&tcu::TestLog::EndMessage);
  std::__cxx11::ostringstream::~ostringstream(this_00);
  return;
}

Assistant:

void ResizeTest::resize (IVec2 size)
{
	m_nativeWindow->setSurfaceSize(size);
	m_testCtx.getPlatform().processEvents();
	m_log << TestLog::Message
		  << "Resized surface to size " << size
		  << TestLog::EndMessage;
}